

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::StdPropertyRestore
               (SnapObject *snpObject,DynamicObject *obj,InflateMap *inflator)

{
  SnapEntryDataKindTag SVar1;
  SnapAttributeTag SVar2;
  uint propertyId;
  TTDVar var;
  SnapHandler *pSVar3;
  Type *pTVar4;
  DynamicTypeHandler *this;
  long *plVar5;
  DynamicType *this_00;
  bool bVar6;
  int iVar7;
  Var pvVar8;
  RecyclableObject *pRVar9;
  SnapHandlerPropertyEntry *pSVar10;
  _func_int **pp_Var11;
  JavascriptArray *objArray;
  Var pvVar12;
  Var pvVar13;
  ulong uVar14;
  Var local_48;
  Var currentValue;
  SnapObject *local_38;
  
  currentValue = inflator;
  (**(code **)(**(long **)((obj->super_RecyclableObject).type.ptr + 1) + 0x80))();
  var = snpObject->SnapType->PrototypeVar;
  local_38 = snpObject;
  if (var != (TTDVar)0x0) {
    pvVar8 = InflateMap::InflateTTDVar((InflateMap *)currentValue,var);
    pRVar9 = Js::VarTo<Js::RecyclableObject>(pvVar8);
    if ((((obj->super_RecyclableObject).type.ptr)->prototype).ptr != pRVar9) {
      (*(obj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x4b])(obj,pRVar9);
    }
  }
  pSVar3 = local_38->SnapType->TypeHandlerInfo;
  uVar14 = 0;
  do {
    if (pSVar3->MaxPropertyIndex <= uVar14) {
      if (local_38->OptIndexedObjectArray != 0) {
        pRVar9 = InflateMap::LookupObject
                           ((InflateMap *)currentValue,local_38->OptIndexedObjectArray);
        objArray = Js::JavascriptArray::FromAnyArray(pRVar9);
        Js::DynamicObject::SetObjectArray(obj,&objArray->super_ArrayObject);
      }
      if (pSVar3->IsExtensibleFlag == '\x01') {
        bVar6 = Js::DynamicObject::GetIsExtensible(obj);
        if (!bVar6) {
          pTVar4 = (obj->super_RecyclableObject).type.ptr;
          if ((*(char *)((long)&pTVar4[1].javascriptLibrary.ptr + 1) != '\0') ||
             (this = *(DynamicTypeHandler **)(pTVar4 + 1), (this->flags & 0x10) != 0)) {
            TTDAbort_unrecoverable_error
                      (
                      "We are just changing the flag so if it is shared this might unexpectedly change another type!"
                      );
          }
          Js::DynamicTypeHandler::SetExtensible_TTD(this);
        }
      }
      else {
        plVar5 = *(long **)((obj->super_RecyclableObject).type.ptr + 1);
        (**(code **)(*plVar5 + 0x1b0))(plVar5,obj);
      }
      bVar6 = local_38->SnapType->HasNoEnumerableProperties;
      this_00 = (DynamicType *)(obj->super_RecyclableObject).type.ptr;
      if (bVar6 != this_00->hasNoEnumerableProperties) {
        Js::DynamicType::SetHasNoEnumerableProperties(this_00,bVar6);
      }
      return;
    }
    if (pSVar3->PropertyInfoArray[uVar14].DataKind != Clear) {
      bVar6 = Js::VarIsImpl<Js::JavascriptProxy>(&obj->super_RecyclableObject);
      if (bVar6) {
        TTDAbort_unrecoverable_error
                  ("I didn\'t think proxies could have real properties directly on them.");
      }
      pSVar10 = pSVar3->PropertyInfoArray;
      propertyId = pSVar10[uVar14].PropertyRecordId;
      if (pSVar10[uVar14].DataKind == Uninitialized) {
        iVar7 = (*(obj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
                  ._vptr_IRecyclerVisitedObject[0xc])(obj,(ulong)propertyId);
        if (iVar7 != 0) {
          TTDAbort_unrecoverable_error
                    (
                    "Shouldn\'t have this defined, or we should have cleared it, and nothing more to do."
                    );
        }
        iVar7 = (*(obj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
                  ._vptr_IRecyclerVisitedObject[0x1c])(obj,(ulong)propertyId);
LAB_0083b770:
        if (iVar7 == 0) {
          TTDAbort_unrecoverable_error("Failed to set property during restore!!!");
        }
      }
      else {
        if (local_38->VarArray[uVar14] == (TTDVar)0x0) {
          pvVar8 = (Var)0x0;
        }
        else {
          pvVar8 = InflateMap::InflateTTDVar((InflateMap *)currentValue,local_38->VarArray[uVar14]);
          pSVar10 = pSVar3->PropertyInfoArray;
        }
        SVar1 = pSVar10[uVar14].DataKind;
        if (SVar1 == Setter) {
          pp_Var11 = (obj->super_RecyclableObject).super_FinalizableObject.
                     super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
          pvVar13 = (Var)0x0;
          pvVar12 = pvVar8;
        }
        else {
          if (SVar1 != Getter) {
            if (SVar1 != Data) {
              TTDAbort_unrecoverable_error("Don\'t know how to restore this accesstag!!");
            }
            iVar7 = (*(obj->super_RecyclableObject).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xc])
                              (obj,(ulong)propertyId);
            if (iVar7 != 0) {
              local_48 = (Var)0x0;
              Js::JavascriptOperators::GetOwnProperty
                        (obj,propertyId,&local_48,
                         (((((obj->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                         super_JavascriptLibraryBase).scriptContext.ptr,(PropertyValueInfo *)0x0);
              iVar7 = 1;
              if (local_48 == pvVar8) goto LAB_0083b770;
            }
            iVar7 = (*(obj->super_RecyclableObject).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
                              (obj,(ulong)propertyId,pvVar8,7,0,0,0xf);
            goto LAB_0083b770;
          }
          pp_Var11 = (obj->super_RecyclableObject).super_FinalizableObject.
                     super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
          pvVar12 = (Var)0x0;
          pvVar13 = pvVar8;
        }
        (*pp_Var11[0x2d])(obj,(ulong)propertyId,pvVar13,pvVar12);
      }
      SVar2 = pSVar3->PropertyInfoArray[uVar14].AttributeInfo;
      iVar7 = (*(obj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x30])(obj,(ulong)propertyId);
      if ((iVar7 != 0) && ((SVar2 & Writable) == Clear)) {
        (*(obj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x3b])(obj,(ulong)propertyId,0);
      }
      iVar7 = (*(obj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x32])(obj,(ulong)propertyId);
      if ((iVar7 != 0) && ((SVar2 & Enumerable) == Clear)) {
        (*(obj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x3d])(obj,(ulong)propertyId,0);
      }
      iVar7 = (*(obj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x31])(obj,(ulong)propertyId);
      if ((iVar7 != 0) && ((SVar2 & Configurable) == Clear)) {
        (*(obj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x3c])(obj,(ulong)propertyId,0);
      }
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void StdPropertyRestore(const SnapObject* snpObject, Js::DynamicObject* obj, InflateMap* inflator)
        {
            obj->GetDynamicType()->GetTypeHandler()->EnsureObjectReady(obj);

            //Many protos are set at creation, don't mess with them if they are already correct
            if(snpObject->SnapType->PrototypeVar != nullptr)
            {
                Js::RecyclableObject* protoObj = Js::VarTo<Js::RecyclableObject>(inflator->InflateTTDVar(snpObject->SnapType->PrototypeVar));
                if(obj->GetType()->GetPrototype() != protoObj)
                {
                    obj->SetPrototype(protoObj);
                }
            }

            //set all the standard properties
            const NSSnapType::SnapHandler* handler = snpObject->SnapType->TypeHandlerInfo;

#if ENABLE_OBJECT_SOURCE_TRACKING
            CopyDiagnosticOriginInformation(obj->TTDDiagOriginInfo, snpObject->DiagOriginInfo);
#endif

            //
            //We assume that placing properties back in the same order we read them out produces correct results.
            //This is not true for enumeration -- but we handle this by explicit logging
            //There may also be sensitivity in other cases -- e.g. activation objects with arguments objects that use slot index values directly.
            //    Things look good in this case but future changes may require care and/or adding special case handling.
            //
            for(uint32 i = 0; i < handler->MaxPropertyIndex; ++i)
            {
                //We have an empty (or uninteresting) slot for so there is nothing to restore
                if(handler->PropertyInfoArray[i].DataKind == NSSnapType::SnapEntryDataKindTag::Clear)
                {
                    continue;
                }

                TTDAssert(!Js::VarIs<Js::JavascriptProxy>(obj), "I didn't think proxies could have real properties directly on them.");

                Js::PropertyId pid = handler->PropertyInfoArray[i].PropertyRecordId;

                if(handler->PropertyInfoArray[i].DataKind == NSSnapType::SnapEntryDataKindTag::Uninitialized)
                {
                    TTDAssert(!obj->HasOwnProperty(pid), "Shouldn't have this defined, or we should have cleared it, and nothing more to do.");

                    BOOL success = obj->EnsureProperty(pid);

                    TTDAssert(success, "Failed to set property during restore!!!");
                }
                else
                {
                    TTDVar ttdVal = snpObject->VarArray[i];
                    Js::Var pVal = (ttdVal != nullptr) ? inflator->InflateTTDVar(ttdVal) : nullptr;

                    if(handler->PropertyInfoArray[i].DataKind == NSSnapType::SnapEntryDataKindTag::Data)
                    {
                        BOOL success = FALSE;
                        if(!obj->HasOwnProperty(pid))
                        {
                            //easy case just set the property
                            success = obj->SetPropertyWithAttributes(pid, pVal, PropertyDynamicTypeDefaults, nullptr);
                        }
                        else
                        {
                            //get the value to see if it is already ok
                            Js::Var currentValue = nullptr;
                            Js::JavascriptOperators::GetOwnProperty(obj, pid, &currentValue, obj->GetScriptContext(), nullptr);

                            if(currentValue == pVal)
                            {
                                //the right value is already there -- easy
                                success = TRUE;
                            }
                            else
                            {
                                //Ok so now we force set the property
                                success = obj->SetPropertyWithAttributes(pid, pVal, PropertyDynamicTypeDefaults, nullptr);
                            }
                        }

                        TTDAssert(success, "Failed to set property during restore!!!");
                    }
                    else
                    {
                        NSSnapType::SnapEntryDataKindTag ttag = handler->PropertyInfoArray[i].DataKind;
                        if(ttag == NSSnapType::SnapEntryDataKindTag::Getter)
                        {
                            obj->SetAccessors(pid, pVal, nullptr);
                        }
                        else if(ttag == NSSnapType::SnapEntryDataKindTag::Setter)
                        {
                            obj->SetAccessors(pid, nullptr, pVal);
                        }
                        else
                        {
                            TTDAssert(false, "Don't know how to restore this accesstag!!");
                        }
                    }
                }

                Js::PropertyAttributes pAttrib = (Js::PropertyAttributes)handler->PropertyInfoArray[i].AttributeInfo;
                if(obj->IsWritable(pid) && (pAttrib & PropertyWritable) == PropertyNone)
                {
                    obj->SetWritable(pid, FALSE);
                }

                if(obj->IsEnumerable(pid) && (pAttrib & PropertyEnumerable) == PropertyNone)
                {
                    obj->SetEnumerable(pid, FALSE);
                }

                if(obj->IsConfigurable(pid) && (pAttrib & PropertyConfigurable) == PropertyNone)
                {
                    obj->SetConfigurable(pid, FALSE);
                }
            }

            if(snpObject->OptIndexedObjectArray != TTD_INVALID_PTR_ID)
            {
                Js::Var objArray = inflator->LookupObject(snpObject->OptIndexedObjectArray);
                obj->SetObjectArray(Js::JavascriptArray::FromAnyArray(objArray));
            }

            //finally set the extensible flag
            if(handler->IsExtensibleFlag != Js::DynamicTypeHandler::IsExtensibleFlag)
            {
                //this automatically updates the type if needed
                obj->GetDynamicType()->GetTypeHandler()->PreventExtensions(obj);
            }
            else
            {
                if(!obj->GetIsExtensible())
                {
                    TTDAssert(!(obj->GetDynamicType()->GetIsShared() || obj->GetDynamicType()->GetTypeHandler()->GetIsShared()), "We are just changing the flag so if it is shared this might unexpectedly change another type!");

                    obj->GetDynamicType()->GetTypeHandler()->SetExtensible_TTD();
                }
            }

            if(snpObject->SnapType->HasNoEnumerableProperties != obj->GetDynamicType()->GetHasNoEnumerableProperties())
            {
                obj->GetDynamicType()->SetHasNoEnumerableProperties(snpObject->SnapType->HasNoEnumerableProperties);
            }
        }